

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  byte bVar1;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  void *__n;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  size_type sVar7;
  int *piVar8;
  float ***pppfVar9;
  float **ppfVar10;
  int **ppiVar11;
  int *piVar12;
  float *pfVar13;
  size_t sVar14;
  char **ppcVar15;
  char *pcVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  byte *extraout_RDX;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  size_t sVar26;
  float fVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  pointer paVar31;
  uint uVar32;
  uchar *src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<float,_std::allocator<float>_> image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<char,_std::allocator<char>_> buf;
  uint local_164;
  int local_160;
  undefined8 local_158;
  allocator_type local_149;
  vector<int,_std::allocator<int>_> local_148;
  ulong local_128;
  pointer local_120;
  string local_118;
  size_type local_f8;
  size_t local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  uint local_cc;
  ulong local_c8;
  string local_c0;
  int *local_a0;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_98;
  void *local_80 [2];
  long local_70;
  size_t local_68;
  int *local_60;
  ulong local_58;
  size_type local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar16 = "Invalid argument.";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar16 = "Cannot read file.";
    }
    else {
      fseek(__stream,0,2);
      sVar7 = ftell(__stream);
      fseek(__stream,0,0);
      if (sVar7 != 0) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_48,sVar7,(allocator_type *)&local_118);
        fread(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,1,sVar7,__stream);
        fclose(__stream);
        iVar4 = *(int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        if (iVar4 == 0x1312f76) {
          piVar12 = (int *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + 4);
        }
        else {
          piVar12 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
          if (err != (char **)0x0) {
            *err = "Header mismatch.";
          }
        }
        iVar23 = -3;
        if (iVar4 == 0x1312f76) {
          if (((((char)*piVar12 == '\x02') && (*(char *)((long)piVar12 + 1) == '\b')) &&
              (*(char *)((long)piVar12 + 2) == '\0')) && (*(char *)((long)piVar12 + 3) == '\0')) {
            local_a0 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start;
            piVar12 = piVar12 + 1;
            local_98.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_160 = 1;
            local_120 = (pointer)0xffffffff;
            local_c8 = 0xffffffff;
            local_128 = CONCAT44(local_128._4_4_,0xffffffff);
            local_f8 = CONCAT44(local_f8._4_4_,0xffffffff);
            local_164 = 0xffffffff;
            local_f0 = CONCAT44(local_f0._4_4_,0xffffffff);
            do {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              local_118._M_string_length = 0;
              local_118.field_2._M_local_buf[0] = '\0';
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              local_c0._M_string_length = 0;
              local_c0.field_2._M_local_buf[0] = '\0';
              local_158 = 0;
              local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              piVar8 = (int *)anon_unknown.dwarf_140df::ReadAttribute
                                        (&local_118,&local_c0,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_148,(char *)piVar12);
              if (piVar8 == (int *)0x0) {
                piVar12 = (int *)((long)piVar12 + 1);
                iVar4 = 2;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_118);
                if (iVar4 == 0) {
                  bVar1 = (byte)*local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  if (3 < bVar1) {
                    iVar23 = -5;
                    iVar4 = 1;
                    if (err != (char **)0x0) {
                      pcVar16 = "Unsupported compression type.";
LAB_00114b59:
                      iVar4 = 1;
                      *err = pcVar16;
                    }
                    goto LAB_00114bd6;
                  }
                  if (bVar1 == 3) {
                    local_160 = 0x10;
                  }
                  local_f0 = CONCAT44(local_f0._4_4_,(uint)bVar1);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_118);
                  if (iVar4 == 0) {
                    anon_unknown.dwarf_140df::ReadChannelInfo
                              (&local_98,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
                    local_164 = (int)((ulong)((long)local_98.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_98.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                -0x55555555;
                    if ((int)local_164 < 1) {
                      iVar23 = -6;
                      iVar4 = 1;
                      if (err != (char **)0x0) {
                        pcVar16 = "Invalid channels format.";
                        goto LAB_00114b59;
                      }
                      goto LAB_00114bd6;
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_118);
                    if (iVar4 == 0) {
                      uVar20 = (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start;
                      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) goto LAB_001152da;
                      if (uVar20 < 5) goto LAB_001152c2;
                      if (uVar20 < 9) {
                        local_158 = 8;
                        goto LAB_001152da;
                      }
                      if (uVar20 < 0xd) {
                        local_158 = 0xc;
                        goto LAB_001152da;
                      }
                      local_f8 = CONCAT44(local_f8._4_4_,
                                          *local_148.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
                      local_128 = CONCAT44(local_128._4_4_,
                                           *(undefined4 *)
                                            ((long)local_148.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start + 4));
                      local_c8 = (ulong)*(uint *)((long)local_148.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8);
                      local_120 = (pointer)(ulong)*(uint *)((long)local_148.
                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 0xc);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)&local_118);
                      iVar4 = 0;
                      if (iVar5 == 0) {
                        uVar20 = (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                        if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish !=
                            local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                          if (uVar20 < 5) goto LAB_001152ed;
                          if (uVar20 < 9) {
                            local_158 = 8;
                          }
                          else {
                            piVar12 = piVar8;
                            if (0xc < uVar20) goto LAB_00114bd6;
                            local_158 = 0xc;
                          }
                        }
                        goto LAB_00115305;
                      }
                    }
                  }
                }
                iVar4 = 0;
                piVar12 = piVar8;
              }
LAB_00114bd6:
              if ((byte *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != (byte *)0x0) {
                operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,
                                CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                         local_c0.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                         local_118.field_2._M_local_buf[0]) + 1);
              }
            } while (iVar4 == 0);
            if (iVar4 == 2) {
              uVar6 = (int)local_c8 - (int)local_f8;
              local_c8 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
              uVar24 = (int)local_120 - (int)local_128;
              uVar32 = uVar24 + 1;
              local_128 = (ulong)uVar6;
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_118,
                         (long)(int)(uVar32 * uVar6 * 4),(allocator_type *)&local_c0);
              uVar6 = (uint)(local_160 * ((int)uVar32 / local_160) <= (int)uVar24) +
                      (int)uVar32 / local_160;
              std::vector<long_long,_std::allocator<long_long>_>::vector
                        ((vector<long_long,_std::allocator<long_long>_> *)&local_c0,(long)(int)uVar6
                         ,(allocator_type *)&local_148);
              if (0 < (int)uVar6) {
                uVar20 = 0;
                do {
                  *(undefined8 *)(local_c0._M_dataplus._M_p + uVar20 * 8) =
                       *(undefined8 *)(piVar12 + uVar20 * 2);
                  uVar20 = uVar20 + 1;
                } while (uVar6 != uVar20);
              }
              if (((uint)local_f0 < 4) && ((uint)local_f0 != 1)) {
                sVar7 = (size_type)(int)local_164;
                local_68 = sVar7 * 8;
                local_120 = (pointer)(ulong)uVar24;
                pppfVar9 = (float ***)malloc(local_68);
                deepImage->image = pppfVar9;
                uVar20 = (ulong)local_164;
                local_cc = uVar32;
                local_50 = sVar7;
                if (0 < (int)local_164) {
                  uVar29 = 0;
                  do {
                    ppfVar10 = (float **)malloc((long)(int)uVar32 * 8);
                    deepImage->image[uVar29] = ppfVar10;
                    uVar29 = uVar29 + 1;
                  } while (uVar20 != uVar29);
                }
                ppiVar11 = (int **)malloc((long)(int)uVar32 << 3);
                deepImage->offset_table = ppiVar11;
                local_f8 = (size_type)(int)local_128;
                if (-1 < (int)local_120) {
                  sVar26 = local_f8 * 4;
                  uVar30 = (ulong)local_cc;
                  uVar29 = 0;
                  do {
                    piVar12 = (int *)malloc(sVar26);
                    deepImage->offset_table[uVar29] = piVar12;
                    uVar29 = uVar29 + 1;
                  } while (uVar30 != uVar29);
                }
                uVar29 = local_128;
                if (0 < (int)uVar6) {
                  local_120 = local_98.
                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_60 = &(local_98.
                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pixelType;
                  uVar30 = 0;
                  local_58 = (ulong)uVar6;
                  do {
                    lVar18 = *(long *)(local_c0._M_dataplus._M_p + uVar30 * 8);
                    srcSize = *(unsigned_long *)((long)local_a0 + lVar18 + 4);
                    srcSize_00 = *(unsigned_long *)((long)local_a0 + lVar18 + 0xc);
                    __n = *(void **)((long)local_a0 + lVar18 + 0x14);
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_148,local_f8,(allocator_type *)&local_e8);
                    pbVar21 = (byte *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish +
                                      -(long)local_148.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = pbVar21;
                    if (pbVar21 == (byte *)0x0) {
LAB_0011529c:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,(long)pbVar21 >> 2);
LAB_001152b0:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
LAB_001152c2:
                      local_158 = 4;
LAB_001152da:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,local_158);
LAB_001152ed:
                      local_158 = 4;
LAB_00115305:
                      uVar17 = std::__throw_out_of_range_fmt
                                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          ,local_158);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                                 local_118.field_2._M_local_buf[0]) -
                                        (long)local_118._M_dataplus._M_p);
                      }
                      std::
                      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ::~vector(&local_98);
                      if ((int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start != (int *)0x0) {
                        operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_48.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_48.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      _Unwind_Resume(uVar17);
                    }
                    src = (uchar *)((long)local_a0 + lVar18 + 0x1c);
                    anon_unknown.dwarf_140df::DecompressZip
                              ((uchar *)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)&local_e8,src,srcSize);
                    if (-1 < (int)local_c8) {
                      piVar12 = deepImage->offset_table[uVar30];
                      uVar22 = 0;
                      do {
                        piVar12[uVar22] =
                             *(int *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + uVar22 * 4);
                        uVar22 = uVar22 + 1;
                      } while (uVar29 != uVar22);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&local_e8,(size_type)__n,(allocator_type *)local_80);
                    local_80[0] = __n;
                    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_001152b0;
                    anon_unknown.dwarf_140df::DecompressZip
                              (local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)local_80,
                               src + srcSize,srcSize_00);
                    std::vector<int,_std::allocator<int>_>::vector
                              ((vector<int,_std::allocator<int>_> *)local_80,local_50,&local_149);
                    if ((int)local_164 < 1) {
                      uVar29 = 0;
                    }
                    else {
                      uVar29 = 0;
                      iVar4 = 0;
                      piVar12 = local_60;
                      do {
                        *(int *)((long)local_80[0] + uVar29 * 4) = iVar4;
                        iVar23 = *piVar12;
                        if (iVar23 == 1) {
                          iVar5 = iVar4 + 2;
                        }
                        else if (iVar23 == 0) {
                          iVar5 = iVar4 + 4;
                        }
                        else {
                          iVar5 = iVar4 + 4;
                          if (iVar23 != 2) {
                            iVar5 = iVar4;
                          }
                        }
                        iVar4 = iVar5;
                        uVar29 = uVar29 + 1;
                        piVar12 = piVar12 + 0xc;
                      } while (uVar20 != uVar29);
                      uVar29 = (ulong)iVar4;
                    }
                    if (0 < (int)local_164) {
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = uVar29;
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = (long)local_e8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_e8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                      lVar18 = SUB168(auVar3 / auVar2,0) << 0x20;
                      sVar26 = lVar18 >> 0x1e;
                      local_f0 = lVar18 >> 0x1f;
                      iVar4 = SUB164(auVar3 / auVar2,0);
                      lVar18 = (long)iVar4;
                      uVar29 = 0;
                      uVar22 = 0;
                      do {
                        pfVar13 = (float *)malloc(sVar26);
                        deepImage->image[uVar29][uVar30] = pfVar13;
                        sVar14 = sVar26;
                        if (local_120[uVar29].pixelType == 0) {
                          if (0 < iVar4) {
                            lVar19 = 0;
                            lVar28 = 0;
                            do {
                              if ((ulong)((long)local_e8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_e8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start) <=
                                  uVar22 + lVar19) goto LAB_0011528e;
                              *(float *)((long)deepImage->image[uVar29][uVar30] + lVar19) =
                                   (float)*(uint *)(local_e8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar19 + uVar22);
                              lVar28 = lVar28 + 1;
                              lVar19 = lVar19 + 4;
                            } while (lVar28 < lVar18);
                          }
                        }
                        else if (local_120[uVar29].pixelType == 1) {
                          sVar14 = local_f0;
                          if (0 < iVar4) {
                            lVar19 = 0;
                            lVar28 = 0;
                            uVar25 = uVar22;
                            do {
                              if ((ulong)((long)local_e8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_e8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start) <= uVar25)
                              {
                                std::__throw_out_of_range_fmt
                                          (
                                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          );
LAB_00115280:
                                std::__throw_out_of_range_fmt
                                          (
                                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          );
LAB_0011528e:
                                std::__throw_out_of_range_fmt
                                          (
                                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          );
                                pbVar21 = extraout_RDX;
                                goto LAB_0011529c;
                              }
                              uVar6 = (uint)*(ushort *)
                                             (local_e8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar25) <<
                                      0xd;
                              if ((uVar6 & 0xf800000) == 0xf800000) {
                                fVar27 = (float)(uVar6 | 0x70000000);
                              }
                              else if ((uVar6 & 0xf800000) == 0) {
                                fVar27 = (float)(uVar6 | 0x38800000) + -6.1035156e-05;
                              }
                              else {
                                fVar27 = (float)((uVar6 & 0xfffe000) + 0x38000000);
                              }
                              *(uint *)((long)deepImage->image[uVar29][uVar30] + lVar19) =
                                   (int)(short)*(ushort *)
                                                (local_e8.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar25)
                                   & 0x80000000U | (uint)fVar27;
                              lVar28 = lVar28 + 1;
                              lVar19 = lVar19 + 4;
                              uVar25 = uVar25 + 2;
                            } while (lVar28 < lVar18);
                          }
                        }
                        else if (0 < iVar4) {
                          lVar19 = 0;
                          lVar28 = 0;
                          do {
                            if ((ulong)((long)local_e8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_e8.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) <=
                                uVar22 + lVar19) goto LAB_00115280;
                            *(undefined4 *)((long)deepImage->image[uVar29][uVar30] + lVar19) =
                                 *(undefined4 *)
                                  (local_e8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar19 + uVar22);
                            lVar28 = lVar28 + 1;
                            lVar19 = lVar19 + 4;
                          } while (lVar28 < lVar18);
                        }
                        uVar22 = uVar22 + sVar14;
                        uVar29 = uVar29 + 1;
                      } while (uVar29 != uVar20);
                    }
                    if (local_80[0] != (void *)0x0) {
                      operator_delete(local_80[0],local_70 - (long)local_80[0]);
                    }
                    uVar22 = local_58;
                    uVar29 = local_128;
                    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                      operator_delete(local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_e8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_e8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((byte *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start != (byte *)0x0) {
                      operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != uVar22);
                }
                deepImage->width = (int)uVar29;
                deepImage->height = local_cc;
                ppcVar15 = (char **)malloc(local_68);
                deepImage->channel_names = ppcVar15;
                if (0 < (int)local_164) {
                  uVar29 = 0;
                  paVar31 = local_98.
                            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    pcVar16 = strdup((paVar31->name)._M_dataplus._M_p);
                    deepImage->channel_names[uVar29] = pcVar16;
                    uVar29 = uVar29 + 1;
                    paVar31 = paVar31 + 1;
                  } while (uVar20 != uVar29);
                }
                deepImage->num_channels = local_164;
                iVar23 = 0;
              }
              else {
                iVar23 = -10;
                if (err != (char **)0x0) {
                  *err = "Unsupported format.";
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_c0._M_dataplus._M_p,
                                CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                         local_c0.field_2._M_local_buf[0]) -
                                (long)local_c0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_118._M_dataplus._M_p,
                                CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                         local_118.field_2._M_local_buf[0]) -
                                (long)local_118._M_dataplus._M_p);
              }
            }
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector(&local_98);
          }
          else {
            iVar23 = -4;
            if (err != (char **)0x0) {
              *err = "Unsupported version or scanline.";
            }
          }
        }
        if ((int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start == (int *)0x0) {
          return iVar23;
        }
        operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return iVar23;
      }
      fclose(__stream);
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar16 = "File size is zero.";
    }
  }
  *err = pcVar16;
  return -1;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) ==
           sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}